

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryGetParent
          (InMemoryDirectory *this,StringPtr name,WriteMode mode)

{
  EVP_PKEY_CTX *ctx;
  undefined8 uVar1;
  Disposer *extraout_RAX;
  _Base_ptr p_Var2;
  Directory *extraout_RDX;
  char *pcVar3;
  ulong in_R8;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar4;
  StringPtr name_00;
  Fault f;
  undefined1 local_88 [32];
  _Base_ptr local_68;
  _Base_ptr p_Stack_60;
  Mutex *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  name_00.content.size_ = name.content.size_;
  pcVar3 = name.content.ptr;
  local_50 = (Mutex *)(pcVar3 + 0x18);
  local_88[0] = (kj)0x0;
  local_88._24_8_ = this;
  kj::_::Mutex::lock(local_50,0);
  name_00.content.ptr = pcVar3 + 0x30;
  Impl::openEntry((Impl *)local_88,name_00,mode);
  ctx = (EVP_PKEY_CTX *)CONCAT71(local_88._1_7_,local_88[0]);
  if (ctx != (EVP_PKEY_CTX *)0x0) {
    if (*(int *)(ctx + 0x18) == 0) {
      uVar1 = (**(code **)**(undefined8 **)(pcVar3 + 0x30))();
      *(undefined8 *)(pcVar3 + 0x70) = uVar1;
      newInMemoryDirectory
                ((kj *)local_88,*(Clock **)(pcVar3 + 0x30),*(InMemoryFileFactory **)(pcVar3 + 0x38))
      ;
      local_68 = (_Base_ptr)CONCAT71(local_88._1_7_,local_88[0]);
      p_Stack_60 = (_Base_ptr)local_88._8_8_;
      EntryImpl::init((EntryImpl *)&local_48,ctx);
      *(undefined4 *)
       &(((Directory *)local_88._24_8_)->super_ReadableDirectory).super_FsNode._vptr_FsNode =
           local_48;
      *(undefined4 *)
       ((long)&(((Directory *)local_88._24_8_)->super_ReadableDirectory).super_FsNode._vptr_FsNode +
       4) = uStack_44;
      *(undefined4 *)&(((AtomicRefcounted *)(local_88._24_8_ + 8))->super_Disposer)._vptr_Disposer =
           uStack_40;
      *(undefined4 *)
       ((long)&(((AtomicRefcounted *)(local_88._24_8_ + 8))->super_Disposer)._vptr_Disposer + 4) =
           uStack_3c;
      if (p_Stack_60 != (_Base_ptr)0x0) {
        p_Stack_60 = (_Base_ptr)0x0;
        (*(code *)**(undefined8 **)local_68)();
      }
      goto LAB_004c7797;
    }
    if (*(int *)(ctx + 0x18) == 2) {
      (**(code **)(**(long **)(ctx + 0x28) + 0x28))(local_88);
      p_Var2 = (_Base_ptr)local_88._8_8_;
      if ((_Base_ptr)local_88._8_8_ != (_Base_ptr)0x0) {
        p_Var2 = (_Base_ptr)CONCAT71(local_88._1_7_,local_88[0]);
      }
      (((Directory *)local_88._24_8_)->super_ReadableDirectory).super_FsNode._vptr_FsNode =
           (_func_int **)p_Var2;
      (((AtomicRefcounted *)(local_88._24_8_ + 8))->super_Disposer)._vptr_Disposer =
           (_func_int **)local_88._8_8_;
      goto LAB_004c7797;
    }
  }
  if ((in_R8 & 1) == 0) {
    (((Directory *)local_88._24_8_)->super_ReadableDirectory).super_FsNode._vptr_FsNode =
         (_func_int **)0x0;
    (((AtomicRefcounted *)(local_88._24_8_ + 8))->super_Disposer)._vptr_Disposer = (_func_int **)0x0
    ;
  }
  else {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
              ((Fault *)local_88,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x6f1,FAILED,(char *)0x0,"\"parent is not a directory\"",
               (char (*) [26])"parent is not a directory");
    (((Directory *)local_88._24_8_)->super_ReadableDirectory).super_FsNode._vptr_FsNode =
         (_func_int **)0x0;
    (((AtomicRefcounted *)(local_88._24_8_ + 8))->super_Disposer)._vptr_Disposer = (_func_int **)0x0
    ;
    kj::_::Debug::Fault::~Fault((Fault *)local_88);
  }
LAB_004c7797:
  kj::_::Mutex::unlock(local_50,EXCLUSIVE,(Waiter *)0x0);
  MVar4.ptr.ptr = extraout_RDX;
  MVar4.ptr.disposer = extraout_RAX;
  return (Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

kj::Maybe<Own<const Directory>> tryGetParent(kj::StringPtr name, WriteMode mode) const {
    // Get a directory which is a parent of the eventual target. If `mode` includes
    // WriteMode::CREATE_PARENTS, possibly create the parent directory.

    auto lock = impl.lockExclusive();

    WriteMode parentMode = has(mode, WriteMode::CREATE) && has(mode, WriteMode::CREATE_PARENT)
        ? WriteMode::CREATE | WriteMode::MODIFY   // create parent
        : WriteMode::MODIFY;                      // don't create parent

    // Possibly create parent.
    KJ_IF_SOME(entry, lock->openEntry(name, parentMode)) {
      if (entry.node.is<DirectoryNode>()) {
        return entry.node.get<DirectoryNode>().directory->clone();
      } else if (entry.node == nullptr) {
        lock->modified();
        return entry.init(DirectoryNode { lock->newDirectory() });
      }
      // Continue on.
    }

    if (has(mode, WriteMode::CREATE)) {
      // CREATE is documented as returning null when the file already exists. In this case, the
      // file does NOT exist because the parent directory does not exist or is not a directory.
      KJ_FAIL_REQUIRE("parent is not a directory") { return kj::none; }
    } else {
      return kj::none;
    }
  }